

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

bool __thiscall gl3cts::TransformFeedback::DrawXFBStream::inspectQueries(DrawXFBStream *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  int local_30;
  int local_2c;
  GLint primitives_written_to_xfb_to_stream_1;
  GLint primitives_written_to_xfb_to_stream_0;
  GLint generated_primitives_to_stream_1;
  GLint generated_primitives_to_stream_0;
  Functions *gl;
  DrawXFBStream *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  _generated_primitives_to_stream_1 = CONCAT44(extraout_var,iVar1);
  primitives_written_to_xfb_to_stream_0 = 0;
  primitives_written_to_xfb_to_stream_1 = 0;
  (**(code **)(_generated_primitives_to_stream_1 + 0xa10))
            (this->m_qo_id[0],0x8866,&primitives_written_to_xfb_to_stream_0);
  dVar2 = (**(code **)(_generated_primitives_to_stream_1 + 0x800))();
  glu::checkError(dVar2,"glGetQueryIndexediv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x15f7);
  (**(code **)(_generated_primitives_to_stream_1 + 0xa10))
            (this->m_qo_id[1],0x8866,&primitives_written_to_xfb_to_stream_1);
  dVar2 = (**(code **)(_generated_primitives_to_stream_1 + 0x800))();
  glu::checkError(dVar2,"glGetQueryIndexediv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x15fa);
  local_2c = 0;
  local_30 = 0;
  (**(code **)(_generated_primitives_to_stream_1 + 0xa10))(this->m_qo_id[2],0x8866,&local_2c);
  dVar2 = (**(code **)(_generated_primitives_to_stream_1 + 0x800))();
  glu::checkError(dVar2,"glGetQueryIndexediv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1600);
  (**(code **)(_generated_primitives_to_stream_1 + 0xa10))(this->m_qo_id[3],0x8866,&local_30);
  dVar2 = (**(code **)(_generated_primitives_to_stream_1 + 0x800))();
  glu::checkError(dVar2,"glGetQueryIndexediv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0x1603);
  if ((((primitives_written_to_xfb_to_stream_0 == 3) && (primitives_written_to_xfb_to_stream_1 == 3)
       ) && (local_2c == 3)) && (local_30 == 3)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool gl3cts::TransformFeedback::DrawXFBStream::inspectQueries()
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint generated_primitives_to_stream_0 = 0;
	glw::GLint generated_primitives_to_stream_1 = 0;

	gl.getQueryObjectiv(m_qo_id[0], GL_QUERY_RESULT, &generated_primitives_to_stream_0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryIndexediv call failed.");

	gl.getQueryObjectiv(m_qo_id[1], GL_QUERY_RESULT, &generated_primitives_to_stream_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryIndexediv call failed.");

	glw::GLint primitives_written_to_xfb_to_stream_0 = 0;
	glw::GLint primitives_written_to_xfb_to_stream_1 = 0;

	gl.getQueryObjectiv(m_qo_id[2], GL_QUERY_RESULT, &primitives_written_to_xfb_to_stream_0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryIndexediv call failed.");

	gl.getQueryObjectiv(m_qo_id[3], GL_QUERY_RESULT, &primitives_written_to_xfb_to_stream_1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryIndexediv call failed.");

	if ((generated_primitives_to_stream_0 == 3) && (generated_primitives_to_stream_1 == 3) &&
		(primitives_written_to_xfb_to_stream_0 == 3) && (primitives_written_to_xfb_to_stream_1 == 3))
	{
		return true;
	}

	return false;
}